

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O2

bool __thiscall HighsLp::equalNames(HighsLp *this,HighsLp *lp)

{
  __type _Var1;
  bool bVar2;
  bool bVar3;
  
  _Var1 = std::operator==(&this->objective_name_,&lp->objective_name_);
  bVar2 = std::operator==(&this->row_names_,&lp->row_names_);
  bVar3 = std::operator==(&this->col_names_,&lp->col_names_);
  return bVar3 && (bVar2 && _Var1);
}

Assistant:

bool HighsLp::equalNames(const HighsLp& lp) const {
  bool equal = true;
  equal = this->objective_name_ == lp.objective_name_ && equal;
  equal = this->row_names_ == lp.row_names_ && equal;
  equal = this->col_names_ == lp.col_names_ && equal;
  return equal;
}